

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3843.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaANCF_3843::CalcCoordVector(ChElementHexaANCF_3843 *this,Vector3N *e)

{
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> local_78;
  VectorBlock<Eigen::Matrix<double,_96,_1,_0,_96,_1>,__1> local_68;
  
  local_78.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((((this->m_nodes).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)->super_ChNodeFEAxyzDD + 0x20);
  Eigen::VectorBlock<Eigen::Matrix<double,_96,_1,_0,_96,_1>,_-1>::VectorBlock
            (&local_68,(Matrix<double,_96,_1,_0,_96,_1> *)e,0,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,96,1,0,96,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,_96,_1,_0,_96,_1>,__1,_1,_false>,&local_78);
  local_78.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((((this->m_nodes).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)->super_ChNodeFEAxyzDD + 0xf0);
  Eigen::VectorBlock<Eigen::Matrix<double,_96,_1,_0,_96,_1>,_-1>::VectorBlock
            (&local_68,(Matrix<double,_96,_1,_0,_96,_1> *)e,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,96,1,0,96,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,_96,_1,_0,_96,_1>,__1,_1,_false>,&local_78);
  local_78.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((((this->m_nodes).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)->super_ChNodeFEAxyzDD + 0x140);
  Eigen::VectorBlock<Eigen::Matrix<double,_96,_1,_0,_96,_1>,_-1>::VectorBlock
            (&local_68,(Matrix<double,_96,_1,_0,_96,_1> *)e,6,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,96,1,0,96,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,_96,_1,_0,_96,_1>,__1,_1,_false>,&local_78);
  local_78.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((((this->m_nodes).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)->super_ChNodeFEAxyzDD + 400);
  Eigen::VectorBlock<Eigen::Matrix<double,_96,_1,_0,_96,_1>,_-1>::VectorBlock
            (&local_68,(Matrix<double,_96,_1,_0,_96,_1> *)e,9,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,96,1,0,96,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,_96,_1,_0,_96,_1>,__1,_1,_false>,&local_78);
  local_78.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzDD + 0x20);
  Eigen::VectorBlock<Eigen::Matrix<double,_96,_1,_0,_96,_1>,_-1>::VectorBlock
            (&local_68,(Matrix<double,_96,_1,_0,_96,_1> *)e,0xc,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,96,1,0,96,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,_96,_1,_0,_96,_1>,__1,_1,_false>,&local_78);
  local_78.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzDD + 0xf0);
  Eigen::VectorBlock<Eigen::Matrix<double,_96,_1,_0,_96,_1>,_-1>::VectorBlock
            (&local_68,(Matrix<double,_96,_1,_0,_96,_1> *)e,0xf,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,96,1,0,96,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,_96,_1,_0,_96,_1>,__1,_1,_false>,&local_78);
  local_78.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzDD + 0x140);
  Eigen::VectorBlock<Eigen::Matrix<double,_96,_1,_0,_96,_1>,_-1>::VectorBlock
            (&local_68,(Matrix<double,_96,_1,_0,_96,_1> *)e,0x12,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,96,1,0,96,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,_96,_1,_0,_96,_1>,__1,_1,_false>,&local_78);
  local_78.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzDD + 400);
  Eigen::VectorBlock<Eigen::Matrix<double,_96,_1,_0,_96,_1>,_-1>::VectorBlock
            (&local_68,(Matrix<double,_96,_1,_0,_96,_1> *)e,0x15,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,96,1,0,96,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,_96,_1,_0,_96,_1>,__1,_1,_false>,&local_78);
  local_78.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[2].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzDD + 0x20);
  Eigen::VectorBlock<Eigen::Matrix<double,_96,_1,_0,_96,_1>,_-1>::VectorBlock
            (&local_68,(Matrix<double,_96,_1,_0,_96,_1> *)e,0x18,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,96,1,0,96,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,_96,_1,_0,_96,_1>,__1,_1,_false>,&local_78);
  local_78.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[2].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzDD + 0xf0);
  Eigen::VectorBlock<Eigen::Matrix<double,_96,_1,_0,_96,_1>,_-1>::VectorBlock
            (&local_68,(Matrix<double,_96,_1,_0,_96,_1> *)e,0x1b,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,96,1,0,96,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,_96,_1,_0,_96,_1>,__1,_1,_false>,&local_78);
  local_78.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[2].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzDD + 0x140);
  Eigen::VectorBlock<Eigen::Matrix<double,_96,_1,_0,_96,_1>,_-1>::VectorBlock
            (&local_68,(Matrix<double,_96,_1,_0,_96,_1> *)e,0x1e,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,96,1,0,96,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,_96,_1,_0,_96,_1>,__1,_1,_false>,&local_78);
  local_78.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[2].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzDD + 400);
  Eigen::VectorBlock<Eigen::Matrix<double,_96,_1,_0,_96,_1>,_-1>::VectorBlock
            (&local_68,(Matrix<double,_96,_1,_0,_96,_1> *)e,0x21,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,96,1,0,96,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,_96,_1,_0,_96,_1>,__1,_1,_false>,&local_78);
  local_78.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[3].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzDD + 0x20);
  Eigen::VectorBlock<Eigen::Matrix<double,_96,_1,_0,_96,_1>,_-1>::VectorBlock
            (&local_68,(Matrix<double,_96,_1,_0,_96,_1> *)e,0x24,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,96,1,0,96,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,_96,_1,_0,_96,_1>,__1,_1,_false>,&local_78);
  local_78.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[3].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzDD + 0xf0);
  Eigen::VectorBlock<Eigen::Matrix<double,_96,_1,_0,_96,_1>,_-1>::VectorBlock
            (&local_68,(Matrix<double,_96,_1,_0,_96,_1> *)e,0x27,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,96,1,0,96,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,_96,_1,_0,_96,_1>,__1,_1,_false>,&local_78);
  local_78.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[3].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzDD + 0x140);
  Eigen::VectorBlock<Eigen::Matrix<double,_96,_1,_0,_96,_1>,_-1>::VectorBlock
            (&local_68,(Matrix<double,_96,_1,_0,_96,_1> *)e,0x2a,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,96,1,0,96,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,_96,_1,_0,_96,_1>,__1,_1,_false>,&local_78);
  local_78.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[3].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzDD + 400);
  Eigen::VectorBlock<Eigen::Matrix<double,_96,_1,_0,_96,_1>,_-1>::VectorBlock
            (&local_68,(Matrix<double,_96,_1,_0,_96,_1> *)e,0x2d,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,96,1,0,96,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,_96,_1,_0,_96,_1>,__1,_1,_false>,&local_78);
  local_78.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[4].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzDD + 0x20);
  Eigen::VectorBlock<Eigen::Matrix<double,_96,_1,_0,_96,_1>,_-1>::VectorBlock
            (&local_68,(Matrix<double,_96,_1,_0,_96,_1> *)e,0x30,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,96,1,0,96,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,_96,_1,_0,_96,_1>,__1,_1,_false>,&local_78);
  local_78.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[4].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzDD + 0xf0);
  Eigen::VectorBlock<Eigen::Matrix<double,_96,_1,_0,_96,_1>,_-1>::VectorBlock
            (&local_68,(Matrix<double,_96,_1,_0,_96,_1> *)e,0x33,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,96,1,0,96,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,_96,_1,_0,_96,_1>,__1,_1,_false>,&local_78);
  local_78.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[4].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzDD + 0x140);
  Eigen::VectorBlock<Eigen::Matrix<double,_96,_1,_0,_96,_1>,_-1>::VectorBlock
            (&local_68,(Matrix<double,_96,_1,_0,_96,_1> *)e,0x36,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,96,1,0,96,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,_96,_1,_0,_96,_1>,__1,_1,_false>,&local_78);
  local_78.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[4].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzDD + 400);
  Eigen::VectorBlock<Eigen::Matrix<double,_96,_1,_0,_96,_1>,_-1>::VectorBlock
            (&local_68,(Matrix<double,_96,_1,_0,_96,_1> *)e,0x39,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,96,1,0,96,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,_96,_1,_0,_96,_1>,__1,_1,_false>,&local_78);
  local_78.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[5].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzDD + 0x20);
  Eigen::VectorBlock<Eigen::Matrix<double,_96,_1,_0,_96,_1>,_-1>::VectorBlock
            (&local_68,(Matrix<double,_96,_1,_0,_96,_1> *)e,0x3c,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,96,1,0,96,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,_96,_1,_0,_96,_1>,__1,_1,_false>,&local_78);
  local_78.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[5].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzDD + 0xf0);
  Eigen::VectorBlock<Eigen::Matrix<double,_96,_1,_0,_96,_1>,_-1>::VectorBlock
            (&local_68,(Matrix<double,_96,_1,_0,_96,_1> *)e,0x3f,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,96,1,0,96,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,_96,_1,_0,_96,_1>,__1,_1,_false>,&local_78);
  local_78.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[5].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzDD + 0x140);
  Eigen::VectorBlock<Eigen::Matrix<double,_96,_1,_0,_96,_1>,_-1>::VectorBlock
            (&local_68,(Matrix<double,_96,_1,_0,_96,_1> *)e,0x42,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,96,1,0,96,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,_96,_1,_0,_96,_1>,__1,_1,_false>,&local_78);
  local_78.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[5].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzDD + 400);
  Eigen::VectorBlock<Eigen::Matrix<double,_96,_1,_0,_96,_1>,_-1>::VectorBlock
            (&local_68,(Matrix<double,_96,_1,_0,_96,_1> *)e,0x45,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,96,1,0,96,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,_96,_1,_0,_96,_1>,__1,_1,_false>,&local_78);
  local_78.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[6].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzDD + 0x20);
  Eigen::VectorBlock<Eigen::Matrix<double,_96,_1,_0,_96,_1>,_-1>::VectorBlock
            (&local_68,(Matrix<double,_96,_1,_0,_96,_1> *)e,0x48,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,96,1,0,96,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,_96,_1,_0,_96,_1>,__1,_1,_false>,&local_78);
  local_78.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[6].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzDD + 0xf0);
  Eigen::VectorBlock<Eigen::Matrix<double,_96,_1,_0,_96,_1>,_-1>::VectorBlock
            (&local_68,(Matrix<double,_96,_1,_0,_96,_1> *)e,0x4b,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,96,1,0,96,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,_96,_1,_0,_96,_1>,__1,_1,_false>,&local_78);
  local_78.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[6].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzDD + 0x140);
  Eigen::VectorBlock<Eigen::Matrix<double,_96,_1,_0,_96,_1>,_-1>::VectorBlock
            (&local_68,(Matrix<double,_96,_1,_0,_96,_1> *)e,0x4e,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,96,1,0,96,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,_96,_1,_0,_96,_1>,__1,_1,_false>,&local_78);
  local_78.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[6].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzDD + 400);
  Eigen::VectorBlock<Eigen::Matrix<double,_96,_1,_0,_96,_1>,_-1>::VectorBlock
            (&local_68,(Matrix<double,_96,_1,_0,_96,_1> *)e,0x51,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,96,1,0,96,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,_96,_1,_0,_96,_1>,__1,_1,_false>,&local_78);
  local_78.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[7].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzDD + 0x20);
  Eigen::VectorBlock<Eigen::Matrix<double,_96,_1,_0,_96,_1>,_-1>::VectorBlock
            (&local_68,(Matrix<double,_96,_1,_0,_96,_1> *)e,0x54,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,96,1,0,96,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,_96,_1,_0,_96,_1>,__1,_1,_false>,&local_78);
  local_78.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[7].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzDD + 0xf0);
  Eigen::VectorBlock<Eigen::Matrix<double,_96,_1,_0,_96,_1>,_-1>::VectorBlock
            (&local_68,(Matrix<double,_96,_1,_0,_96,_1> *)e,0x57,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,96,1,0,96,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,_96,_1,_0,_96,_1>,__1,_1,_false>,&local_78);
  local_78.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[7].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzDD + 0x140);
  Eigen::VectorBlock<Eigen::Matrix<double,_96,_1,_0,_96,_1>,_-1>::VectorBlock
            (&local_68,(Matrix<double,_96,_1,_0,_96,_1> *)e,0x5a,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,96,1,0,96,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,_96,_1,_0,_96,_1>,__1,_1,_false>,&local_78);
  local_78.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[7].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzDD + 400);
  Eigen::VectorBlock<Eigen::Matrix<double,_96,_1,_0,_96,_1>,_-1>::VectorBlock
            (&local_68,(Matrix<double,_96,_1,_0,_96,_1> *)e,0x5d,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,96,1,0,96,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,_96,_1,_0,_96,_1>,__1,_1,_false>,&local_78);
  return;
}

Assistant:

void ChElementHexaANCF_3843::CalcCoordVector(Vector3N& e) {
    e.segment(0, 3) = m_nodes[0]->GetPos().eigen();
    e.segment(3, 3) = m_nodes[0]->GetD().eigen();
    e.segment(6, 3) = m_nodes[0]->GetDD().eigen();
    e.segment(9, 3) = m_nodes[0]->GetDDD().eigen();

    e.segment(12, 3) = m_nodes[1]->GetPos().eigen();
    e.segment(15, 3) = m_nodes[1]->GetD().eigen();
    e.segment(18, 3) = m_nodes[1]->GetDD().eigen();
    e.segment(21, 3) = m_nodes[1]->GetDDD().eigen();

    e.segment(24, 3) = m_nodes[2]->GetPos().eigen();
    e.segment(27, 3) = m_nodes[2]->GetD().eigen();
    e.segment(30, 3) = m_nodes[2]->GetDD().eigen();
    e.segment(33, 3) = m_nodes[2]->GetDDD().eigen();

    e.segment(36, 3) = m_nodes[3]->GetPos().eigen();
    e.segment(39, 3) = m_nodes[3]->GetD().eigen();
    e.segment(42, 3) = m_nodes[3]->GetDD().eigen();
    e.segment(45, 3) = m_nodes[3]->GetDDD().eigen();

    e.segment(48, 3) = m_nodes[4]->GetPos().eigen();
    e.segment(51, 3) = m_nodes[4]->GetD().eigen();
    e.segment(54, 3) = m_nodes[4]->GetDD().eigen();
    e.segment(57, 3) = m_nodes[4]->GetDDD().eigen();

    e.segment(60, 3) = m_nodes[5]->GetPos().eigen();
    e.segment(63, 3) = m_nodes[5]->GetD().eigen();
    e.segment(66, 3) = m_nodes[5]->GetDD().eigen();
    e.segment(69, 3) = m_nodes[5]->GetDDD().eigen();

    e.segment(72, 3) = m_nodes[6]->GetPos().eigen();
    e.segment(75, 3) = m_nodes[6]->GetD().eigen();
    e.segment(78, 3) = m_nodes[6]->GetDD().eigen();
    e.segment(81, 3) = m_nodes[6]->GetDDD().eigen();

    e.segment(84, 3) = m_nodes[7]->GetPos().eigen();
    e.segment(87, 3) = m_nodes[7]->GetD().eigen();
    e.segment(90, 3) = m_nodes[7]->GetDD().eigen();
    e.segment(93, 3) = m_nodes[7]->GetDDD().eigen();
}